

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O2

void __thiscall Chromosome::walkPath(Chromosome *this)

{
  vector<Coordinate,_std::allocator<Coordinate>_> *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  pointer ppVar3;
  bool bVar4;
  int iVar5;
  reference pvVar6;
  char *pcVar7;
  reference pvVar8;
  pointer pCVar9;
  ulong __n;
  pointer pCVar10;
  Chromosome *this_01;
  ulong __n_00;
  undefined1 auVar11 [16];
  pair<Coordinate,_Coordinate> local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  
  this->collisions = 0;
  ppVar3 = (this->pairs).
           super__Vector_base<std::pair<Coordinate,_Coordinate>,_std::allocator<std::pair<Coordinate,_Coordinate>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->pairs).
      super__Vector_base<std::pair<Coordinate,_Coordinate>,_std::allocator<std::pair<Coordinate,_Coordinate>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar3) {
    (this->pairs).
    super__Vector_base<std::pair<Coordinate,_Coordinate>,_std::allocator<std::pair<Coordinate,_Coordinate>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar3;
  }
  this_00 = &this->pathList;
  pCVar10 = (this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar9 = (this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (__n_00 = 0; __n_00 < (ulong)(((long)pCVar9 - (long)pCVar10) / 0xc); __n_00 = __n_00 + 1) {
    pvVar6 = std::vector<Coordinate,_std::allocator<Coordinate>_>::at(this_00,__n_00);
    local_48._0_4_ = pvVar6->x;
    local_48._4_4_ = pvVar6->y;
    uStack_40 = 0;
    __n = __n_00 + 2;
    while( true ) {
      pCVar10 = (this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl
                .super__Vector_impl_data._M_start;
      pCVar9 = (this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((ulong)(((long)pCVar9 - (long)pCVar10) / 0xc) <= __n) break;
      pvVar6 = std::vector<Coordinate,_std::allocator<Coordinate>_>::at(this_00,__n);
      uVar1 = pvVar6->x;
      uVar2 = pvVar6->y;
      auVar11._0_4_ = -(uint)(uVar1 == (int)local_48);
      auVar11._4_4_ = auVar11._0_4_;
      auVar11._8_4_ = -(uint)(uVar2 == local_48._4_4_);
      auVar11._12_4_ = -(uint)(uVar2 == local_48._4_4_);
      iVar5 = movmskpd((int)pvVar6,auVar11);
      if (iVar5 == 3) {
        this->collisions = this->collisions + 1;
      }
      pcVar7 = (char *)std::__cxx11::string::at(0x112360);
      if (*pcVar7 == '1') {
        pcVar7 = (char *)std::__cxx11::string::at(0x112360);
        if (*pcVar7 != '\0') {
          pvVar6 = std::vector<Coordinate,_std::allocator<Coordinate>_>::at(this_00,__n_00);
          this_01 = (Chromosome *)this_00;
          pvVar8 = std::vector<Coordinate,_std::allocator<Coordinate>_>::at(this_00,__n);
          bVar4 = isPair(this_01,pvVar6,pvVar8);
          if (bVar4) {
            pvVar6 = std::vector<Coordinate,_std::allocator<Coordinate>_>::at(this_00,__n_00);
            pvVar8 = std::vector<Coordinate,_std::allocator<Coordinate>_>::at(this_00,__n);
            local_60.first.facing = pvVar6->facing;
            local_60.first.x = pvVar6->x;
            local_60.first.y = pvVar6->y;
            local_60.second.facing = pvVar8->facing;
            local_60.second.x = pvVar8->x;
            local_60.second.y = pvVar8->y;
            std::
            vector<std::pair<Coordinate,Coordinate>,std::allocator<std::pair<Coordinate,Coordinate>>>
            ::emplace_back<std::pair<Coordinate,Coordinate>>
                      ((vector<std::pair<Coordinate,Coordinate>,std::allocator<std::pair<Coordinate,Coordinate>>>
                        *)&this->pairs,&local_60);
          }
        }
      }
      __n = __n + 1;
    }
  }
  return;
}

Assistant:

void Chromosome::walkPath() {

    // reset collisions counter;
    this->collisions = 0;
    pairs.clear();


    Coordinate cord1;
    Coordinate cord2;

    for (size_t i = 0; i < pathList.size(); i++){
        cord1 =  pathList.at(i);
        for(size_t j = i + 2; j < pathList.size(); j++){
            cord2 = pathList.at(j);
            if(cord1.x == cord2.x && cord1.y == cord2.y) {
                collisions++;
            }
            if(GeneticAlgorithm::params.sequence.at(i) == '1' && GeneticAlgorithm::params.sequence.at(j)){
                if (isPair(pathList.at(i), pathList.at(j))){
                    pairs.push_back(std::make_pair<Coordinate, Coordinate>(
                            (Coordinate &&) pathList.at(i),
                            (Coordinate &&) pathList.at(j))
                    );
                }
            }
        }
    }
}